

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istreamwrapper.h
# Opt level: O0

void __thiscall
rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read
          (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *this)

{
  long *plVar1;
  ulong uVar2;
  size_t sVar3;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *this_local;
  
  if (this->current_ < this->bufferLast_) {
    this->current_ = this->current_ + 1;
  }
  else if ((this->eof_ & 1U) == 0) {
    this->count_ = this->readCount_ + this->count_;
    this->readCount_ = this->bufferSize_;
    this->bufferLast_ = this->buffer_ + (this->readCount_ - 1);
    this->current_ = this->buffer_;
    plVar1 = (long *)std::istream::read((char *)this->stream_,(long)this->buffer_);
    uVar2 = std::ios::operator!((ios *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    if ((uVar2 & 1) != 0) {
      sVar3 = std::istream::gcount();
      this->readCount_ = sVar3;
      this->bufferLast_ = this->buffer_ + this->readCount_;
      this->buffer_[this->readCount_] = '\0';
      this->eof_ = true;
    }
  }
  return;
}

Assistant:

void Read() {
        if (current_ < bufferLast_)
            ++current_;
        else if (!eof_) {
            count_ += readCount_;
            readCount_ = bufferSize_;
            bufferLast_ = buffer_ + readCount_ - 1;
            current_ = buffer_;

            if (!stream_.read(buffer_, static_cast<std::streamsize>(bufferSize_))) {
                readCount_ = static_cast<size_t>(stream_.gcount());
                *(bufferLast_ = buffer_ + readCount_) = '\0';
                eof_ = true;
            }
        }
    }